

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap3.c
# Opt level: O2

void Cffgprh(fitsfile *fptr,int *simple,int *bitpix,int *naxis,int *naxes,long *pcount,long *gcount,
            int *extend,int *status)

{
  long *naxes_00;
  long size;
  int local_38;
  undefined4 uStack_34;
  
  ffgkyj(fptr,"NAXIS",(long *)&local_38,(char *)0x0,status);
  naxes_00 = F2Clongv(CONCAT44(uStack_34,local_38),naxes);
  ffghpr(fptr,local_38,simple,bitpix,naxis,naxes_00,pcount,gcount,extend,status);
  C2Flongv(CONCAT44(uStack_34,local_38),naxes,naxes_00);
  return;
}

Assistant:

void Cffgprh( fitsfile *fptr, int *simple, int *bitpix, int *naxis, int naxes[],
             long *pcount, long *gcount, int *extend, int *status )
{
   long *LONGnaxes, size;

   ffgkyj( fptr, "NAXIS", &size, 0, status );
   LONGnaxes = F2Clongv(size,naxes);
   ffghpr( fptr, (int)size, simple, bitpix, naxis, LONGnaxes,
           pcount, gcount, extend, status );
   C2Flongv(size,naxes,LONGnaxes);
}